

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString PrintableStringFromOrNull(char *expected)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  char *in_RSI;
  SimpleString SVar2;
  SimpleString local_20;
  
  if (in_RSI == (char *)0x0) {
    SimpleString::SimpleString((SimpleString *)expected,"(null)");
    sVar1 = extraout_RDX_00;
  }
  else {
    SimpleString::SimpleString(&local_20,in_RSI);
    SimpleString::printable((SimpleString *)expected);
    SimpleString::~SimpleString(&local_20);
    sVar1 = extraout_RDX;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = expected;
  return SVar2;
}

Assistant:

SimpleString PrintableStringFromOrNull(const char * expected)
{
    return (expected) ? StringFrom(expected).printable() : "(null)";
}